

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dimensions.hpp
# Opt level: O0

size_t std::experimental::detail::index_into_dynamic_dims<unsigned_long,unsigned_long>
                 (unsigned_long idx,unsigned_long head)

{
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  unsigned_long head_local;
  unsigned_long idx_local;
  
  if ((head == 0xffffffffffffffff) && (idx != 0)) {
    if (idx == 0) {
      local_20 = 0;
    }
    else {
      local_20 = idx - 1;
    }
    local_28 = index_into_dynamic_dims<unsigned_long>(local_20);
    local_28 = local_28 + 1;
  }
  else {
    if (idx == 0) {
      local_30 = 0;
    }
    else {
      local_30 = idx - 1;
    }
    local_28 = index_into_dynamic_dims<unsigned_long>(local_30);
  }
  return local_28;
}

Assistant:

inline constexpr std::size_t index_into_dynamic_dims(
    Idx idx, Head head, Tail... tail
    ) noexcept
{
    return
        // FIXME: Is idx != 0 needed
        ( head == dyn && idx != 0
        ? index_into_dynamic_dims((idx != 0 ? idx - 1 : idx), tail...) + 1
        : index_into_dynamic_dims((idx != 0 ? idx - 1 : idx), tail...)
        );
}